

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O2

void add_qemu_ldst_label(TCGContext_conflict9 *s,_Bool is_ld,_Bool is_64,TCGMemOpIdx oi,
                        TCGReg datalo,TCGReg datahi,TCGReg addrlo,TCGReg addrhi,tcg_insn_unit *raddr
                        ,tcg_insn_unit **label_ptr)

{
  TCGLabelQemuLdst *pTVar1;
  undefined7 in_register_00000011;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_00000014;
  
  pTVar1 = (TCGLabelQemuLdst *)tcg_malloc(s,0x40);
  (pTVar1->next).sqe_next = (TCGLabelQemuLdst *)0x0;
  *(s->ldst_labels).sqh_last = pTVar1;
  (s->ldst_labels).sqh_last = &(pTVar1->next).sqe_next;
  pTVar1->is_ld = is_ld;
  pTVar1->oi = oi;
  pTVar1->type = (TCGType)CONCAT71(in_register_00000011,is_64);
  pTVar1->datalo_reg = datalo;
  pTVar1->datahi_reg = TCG_REG_EAX;
  pTVar1->addrlo_reg = datahi;
  pTVar1->addrhi_reg = TCG_REG_EAX;
  pTVar1->raddr = (tcg_insn_unit *)CONCAT44(in_stack_0000000c,addrlo);
  pTVar1->label_ptr[0] = *(tcg_insn_unit **)CONCAT44(in_stack_00000014,addrhi);
  return;
}

Assistant:

static void add_qemu_ldst_label(TCGContext *s, bool is_ld, bool is_64,
                                TCGMemOpIdx oi,
                                TCGReg datalo, TCGReg datahi,
                                TCGReg addrlo, TCGReg addrhi,
                                tcg_insn_unit *raddr,
                                tcg_insn_unit **label_ptr)
{
    TCGLabelQemuLdst *label = new_ldst_label(s);

    label->is_ld = is_ld;
    label->oi = oi;
    label->type = is_64 ? TCG_TYPE_I64 : TCG_TYPE_I32;
    label->datalo_reg = datalo;
    label->datahi_reg = datahi;
    label->addrlo_reg = addrlo;
    label->addrhi_reg = addrhi;
    label->raddr = raddr;
    label->label_ptr[0] = label_ptr[0];
    if (TARGET_LONG_BITS > TCG_TARGET_REG_BITS) {
        label->label_ptr[1] = label_ptr[1];
    }
}